

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O2

string_t __thiscall
duckdb::ReverseOperator::Operation<duckdb::string_t,duckdb::string_t>
          (ReverseOperator *this,string_t input,Vector *result)

{
  bool bVar1;
  char *pcVar2;
  Vector *pVVar3;
  char *s;
  char *pcVar4;
  Vector *vector;
  GraphemeCluster GVar5;
  string_t target;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  anon_union_16_2_67f50693_for_value local_98;
  undefined8 local_88;
  char *local_80;
  GraphemeIterator local_78;
  GraphemeClusterIterator local_68;
  GraphemeClusterIterator local_48;
  
  local_80 = input.value._0_8_;
  s = local_80;
  if ((uint)this < 0xd) {
    s = (char *)((long)&local_88 + 4);
  }
  vector = (Vector *)((ulong)this & 0xffffffff);
  local_88 = this;
  local_98.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector,(idx_t)input.value._8_8_);
  pcVar4 = local_98._8_8_;
  if (local_98._0_4_ < 0xd) {
    pcVar4 = local_98.pointer.prefix;
  }
  pcVar2 = pcVar4 + (long)vector;
  pVVar3 = (Vector *)0x0;
  do {
    pcVar2 = pcVar2 + -1;
    if (vector == pVVar3) {
LAB_01d8eddd:
      string_t::Finalize((string_t *)&local_98.pointer);
      return (anon_union_16_2_67f50693_for_value)
             (anon_union_16_2_67f50693_for_value)local_98.pointer;
    }
    if (s[(long)pVVar3] < '\0') {
      if (pVVar3 < vector) {
        local_78 = Utf8Proc::GraphemeClusters(s,(size_t)vector);
        GraphemeIterator::begin(&local_48,&local_78);
        GraphemeIterator::end(&local_68,&local_78);
        while( true ) {
          bVar1 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_48,&local_68);
          if (!bVar1) break;
          GVar5 = GraphemeIterator::GraphemeClusterIterator::operator*(&local_48);
          switchD_0193dc74::default
                    (pcVar4 + (long)vector + -GVar5.end,s + GVar5.start,GVar5.end - GVar5.start);
          GraphemeIterator::GraphemeClusterIterator::operator++(&local_48);
        }
      }
      goto LAB_01d8eddd;
    }
    *pcVar2 = s[(long)pVVar3];
    pVVar3 = (Vector *)&pVVar3->field_0x1;
  } while( true );
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();

		auto target = StringVector::EmptyString(result, input_length);
		auto target_data = target.GetDataWriteable();
		if (!StrReverseASCII(input_data, input_length, target_data)) {
			StrReverseUnicode(input_data, input_length, target_data);
		}
		target.Finalize();
		return target;
	}